

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

void thrd_exit(int res)

{
  int *__retval;
  void *pres;
  int res_local;
  
  __retval = (int *)malloc(4);
  if (__retval != (int *)0x0) {
    *__retval = res;
  }
  pthread_exit(__retval);
}

Assistant:

void thrd_exit(int res)
{
#if defined(_TTHREAD_WIN32_)
  ExitThread(res);
#else
  void *pres = malloc(sizeof(int));
  if (pres != NULL)
  {
    *(int*)pres = res;
  }
  pthread_exit(pres);
#endif
}